

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::DepthStencilCase::init(DepthStencilCase *this,EVP_PKEY_CTX *ctx)

{
  TestRenderTarget *target;
  int iVar1;
  int iVar2;
  pointer pRVar3;
  int extraout_EAX;
  RenderTarget *pRVar4;
  QuadRenderer *this_00;
  Surface *this_01;
  TextureLevel *pTVar5;
  ReferenceQuadRenderer *this_02;
  long lVar6;
  int height;
  int ndx;
  long lVar7;
  int width;
  long lVar8;
  TextureFormat local_38;
  
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar4->m_width;
  if (0x2f < pRVar4->m_width) {
    width = 0x30;
  }
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x30;
  if (pRVar4->m_height < 0x30) {
    height = pRVar4->m_height;
  }
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar4->m_depthBits;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar4->m_stencilBits;
  target = &this->m_renderTarget;
  (this->m_renderTarget).width = width;
  (this->m_renderTarget).height = height;
  (this->m_renderTarget).depthBits = iVar1;
  (this->m_renderTarget).stencilBits = iVar2;
  DepthStencilCaseUtil::generateBaseClearAndDepthCommands
            (target,&this->m_baseClears,&this->m_baseDepthRenders);
  DepthStencilCaseUtil::generateDepthVisualizeCommands(target,&this->m_visualizeCommands);
  DepthStencilCaseUtil::generateStencilVisualizeCommands(target,&this->m_visualizeCommands);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
  ::resize(&this->m_refBaseDepthRenders,
           ((long)(this->m_baseDepthRenders).
                  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_baseDepthRenders).
                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x74);
  lVar6 = 0;
  lVar8 = 0;
  lVar7 = 0;
  while( true ) {
    pRVar3 = (this->m_baseDepthRenders).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_baseDepthRenders).
                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) / 0x74) <= lVar7)
    break;
    DepthStencilCaseUtil::translateCommand
              ((RenderCommand *)((long)(pRVar3->params).stencil + lVar6 + -8),
               (RefRenderCommand *)
               ((long)(((this->m_refBaseDepthRenders).
                        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start)->quad).posA.m_data + lVar8),
               target);
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0x140;
    lVar6 = lVar6 + 0x74;
  }
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
  ::resize(&this->m_refVisualizeCommands,
           ((long)(this->m_visualizeCommands).
                  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_visualizeCommands).
                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x74);
  lVar6 = 0;
  lVar8 = 0;
  lVar7 = 0;
  while( true ) {
    pRVar3 = (this->m_visualizeCommands).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_visualizeCommands).
                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) / 0x74) <= lVar7)
    break;
    DepthStencilCaseUtil::translateCommand
              ((RenderCommand *)((long)(pRVar3->params).stencil + lVar6 + -8),
               (RefRenderCommand *)
               ((long)(((this->m_refVisualizeCommands).
                        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start)->quad).posA.m_data + lVar8),
               target);
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0x140;
    lVar6 = lVar6 + 0x74;
  }
  this_00 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_100_ES);
  this->m_renderer = this_00;
  this_01 = (Surface *)operator_new(0x18);
  tcu::Surface::Surface(this_01,width,height);
  this->m_refColorBuffer = this_01;
  pTVar5 = (TextureLevel *)operator_new(0x28);
  local_38.order = D;
  local_38.type = FLOAT;
  tcu::TextureLevel::TextureLevel(pTVar5,&local_38,width,height,1);
  this->m_refDepthBuffer = pTVar5;
  pTVar5 = (TextureLevel *)operator_new(0x28);
  local_38.order = S;
  local_38.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(pTVar5,&local_38,width,height,1);
  this->m_refStencilBuffer = pTVar5;
  this_02 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_02);
  this->m_refRenderer = this_02;
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void DepthStencilCase::init (void)
{
	DE_ASSERT(!m_renderer && !m_refColorBuffer && !m_refDepthBuffer && !m_refStencilBuffer && !m_refRenderer);

	// Compute render target.
	int viewportW	= de::min<int>(m_context.getRenderTarget().getWidth(), VIEWPORT_WIDTH);
	int viewportH	= de::min<int>(m_context.getRenderTarget().getHeight(), VIEWPORT_HEIGHT);
	m_renderTarget	= TestRenderTarget(viewportW, viewportH, m_context.getRenderTarget().getDepthBits(), m_context.getRenderTarget().getStencilBits());

	// Compute base clears & visualization commands.
	generateBaseClearAndDepthCommands(m_renderTarget, m_baseClears, m_baseDepthRenders);
	generateDepthVisualizeCommands(m_renderTarget, m_visualizeCommands);
	generateStencilVisualizeCommands(m_renderTarget, m_visualizeCommands);

	// Translate to ref commands.
	m_refBaseDepthRenders.resize(m_baseDepthRenders.size());
	for (int ndx = 0; ndx < (int)m_baseDepthRenders.size(); ndx++)
		translateCommand(m_baseDepthRenders[ndx], m_refBaseDepthRenders[ndx], m_renderTarget);

	m_refVisualizeCommands.resize(m_visualizeCommands.size());
	for (int ndx = 0; ndx < (int)m_visualizeCommands.size(); ndx++)
		translateCommand(m_visualizeCommands[ndx], m_refVisualizeCommands[ndx], m_renderTarget);

	m_renderer			= new gls::FragmentOpUtil::QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_refColorBuffer	= new tcu::Surface(viewportW, viewportH);
	m_refDepthBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT),			viewportW, viewportH);
	m_refStencilBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT32),	viewportW, viewportH);
	m_refRenderer		= new gls::FragmentOpUtil::ReferenceQuadRenderer();

	m_iterNdx			= 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}